

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenSky.cpp
# Opt level: O0

unsigned_long GetHexId(string *ln)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *__nptr;
  undefined8 local_8;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 6) {
    uVar3 = std::__cxx11::string::begin();
    uVar4 = std::__cxx11::string::end();
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,GetHexId(std::__cxx11::string_const&)::__0>
                      (uVar3,uVar4);
    if (bVar1) {
      __nptr = (char *)std::__cxx11::string::c_str();
      local_8 = strtoul(__nptr,(char **)0x0,0x10);
    }
    else {
      local_8 = 0xf000000;
    }
  }
  else {
    local_8 = 0xf000000;
  }
  return local_8;
}

Assistant:

unsigned long GetHexId (const std::string& ln)
{
    // must have exactly 6 chars
    if (ln.size() != 6)
        return 0x0F000000UL;
    
    // Test for all hex digits
    if (!std::all_of(ln.begin(),
                     ln.end(),
                     [](const char& ch){ return std::isxdigit(ch); }))
        return 0x0F000000UL;

    // convert text to number
    return std::strtoul(ln.c_str(), nullptr, 16);
}